

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::get_number(lexer *this,
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *result,token_type token)

{
  bool bVar1;
  json_value local_70;
  json_value local_68;
  number_float_t local_60;
  number_float_t val;
  number_integer_t local_50;
  number_integer_t val_2;
  number_unsigned_t local_40;
  number_unsigned_t val_1;
  strtonum num_converter;
  token_type token_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *result_local;
  lexer *this_local;
  
  num_converter.m_end._4_4_ = token;
  if (this->m_start == (lexer_char_t *)0x0) {
    __assert_fail("m_start != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2bfd,
                  "bool nlohmann::basic_json<>::lexer::get_number(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType, JSONSerializer> &, const token_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (this->m_start < this->m_cursor) {
    bVar1 = true;
    if ((token != value_unsigned) && (bVar1 = true, token != value_integer)) {
      bVar1 = token == value_float;
    }
    if (bVar1) {
      strtonum::strtonum((strtonum *)&val_1,(char *)this->m_start,(char *)this->m_cursor);
      if (num_converter.m_end._4_4_ == value_unsigned) {
        bVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::lexer::strtonum::to<unsigned_long,void>((strtonum *)&val_1,&local_40);
        if (bVar1) {
          result->m_type = number_unsigned;
          json_value::json_value((json_value *)&val_2,local_40);
          (result->m_value).number_integer = val_2;
          return true;
        }
      }
      else if ((num_converter.m_end._4_4_ == value_integer) &&
              (bVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::lexer::strtonum::to<long,void>((strtonum *)&val_1,&local_50), bVar1)) {
        result->m_type = number_integer;
        json_value::json_value((json_value *)&val,local_50);
        (result->m_value).number_float = val;
        return true;
      }
      bVar1 = basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::lexer::strtonum::to<double,void>((strtonum *)&val_1,&local_60);
      if (bVar1) {
        result->m_type = number_float;
        json_value::json_value((json_value *)&local_68.boolean,local_60);
        result->m_value = local_68;
        bVar1 = std::isfinite((result->m_value).number_float);
        if (!bVar1) {
          result->m_type = null;
          memset(&local_70,0,8);
          result->m_value = local_70;
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    __assert_fail("(token == token_type::value_unsigned) or (token == token_type::value_integer) or (token == token_type::value_float)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2c01,
                  "bool nlohmann::basic_json<>::lexer::get_number(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType, JSONSerializer> &, const token_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  __assert_fail("m_start < m_cursor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                ,0x2bfe,
                "bool nlohmann::basic_json<>::lexer::get_number(basic_json<ObjectType, ArrayType, StringType, BooleanType, NumberIntegerType, NumberUnsignedType, NumberFloatType, AllocatorType, JSONSerializer> &, const token_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
               );
}

Assistant:

bool get_number(basic_json& result, const token_type token) const
        {
            assert(m_start != nullptr);
            assert(m_start < m_cursor);
            assert((token == token_type::value_unsigned) or
                   (token == token_type::value_integer) or
                   (token == token_type::value_float));

            strtonum num_converter(reinterpret_cast<const char*>(m_start),
                                   reinterpret_cast<const char*>(m_cursor));

            switch (token)
            {
                case lexer::token_type::value_unsigned:
                {
                    number_unsigned_t val;
                    if (num_converter.to(val))
                    {
                        // parsing successful
                        result.m_type = value_t::number_unsigned;
                        result.m_value = val;
                        return true;
                    }
                    break;
                }

                case lexer::token_type::value_integer:
                {
                    number_integer_t val;
                    if (num_converter.to(val))
                    {
                        // parsing successful
                        result.m_type = value_t::number_integer;
                        result.m_value = val;
                        return true;
                    }
                    break;
                }

                default:
                {
                    break;
                }
            }

            // parse float (either explicitly or because a previous conversion
            // failed)
            number_float_t val;
            if (num_converter.to(val))
            {
                // parsing successful
                result.m_type = value_t::number_float;
                result.m_value = val;

                // replace infinity and NAN by null
                if (not std::isfinite(result.m_value.number_float))
                {
                    result.m_type  = value_t::null;
                    result.m_value = basic_json::json_value();
                }

                return true;
            }

            // couldn't parse number in any format
            return false;
        }